

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSVIWriterHandlers.cpp
# Opt level: O0

void __thiscall PSVIWriterHandlers::processFields(PSVIWriterHandlers *this,StringList *fields)

{
  XMLSize_t XVar1;
  char16_t *xpath;
  uint local_1c;
  uint i;
  StringList *fields_local;
  PSVIWriterHandlers *this_local;
  
  sendIndentedElement(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgFields);
  local_1c = 0;
  while( true ) {
    XVar1 = xercesc_4_0::BaseRefVectorOf<char16_t>::size(&fields->super_BaseRefVectorOf<char16_t>);
    if (XVar1 <= local_1c) break;
    xpath = xercesc_4_0::BaseRefVectorOf<char16_t>::elementAt
                      (&fields->super_BaseRefVectorOf<char16_t>,(ulong)local_1c);
    processXPath(this,xpath);
    local_1c = local_1c + 1;
  }
  sendUnindentedElement(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgFields);
  return;
}

Assistant:

void PSVIWriterHandlers::processFields(StringList* fields) {
	sendIndentedElement(PSVIUni::fgFields);
	for (unsigned int i=0; i < fields->size(); i++) {
		processXPath(fields->elementAt(i));
	}
	sendUnindentedElement(PSVIUni::fgFields);
}